

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O2

int wally_hex_verify(char *hex)

{
  int iVar1;
  size_t hex_len;
  
  if (hex == (char *)0x0) {
    hex_len = 0;
  }
  else {
    hex_len = strlen(hex);
  }
  iVar1 = wally_hex_n_verify(hex,hex_len);
  return iVar1;
}

Assistant:

int wally_hex_verify(const char *hex)
{
    return wally_hex_n_verify(hex, hex ? strlen(hex) : 0);
}